

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int kernel_w;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  float *pfVar8;
  Mat *in_RCX;
  Mat *in_RDX;
  long *in_RSI;
  void *pvVar9;
  long *in_RDI;
  bool bVar10;
  float fVar11;
  double dVar12;
  int in_stack_000000a0;
  int in_stack_000000a4;
  Mat *in_stack_000000a8;
  Mat *in_stack_000000b0;
  Mat *in_stack_000000b8;
  Mat *in_stack_000000c0;
  float w_2;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  float sum;
  int j;
  int i;
  int outh_1;
  int outw_1;
  int channels;
  int h_1;
  int w_1;
  float *outptr;
  int p;
  int maxk;
  Mat top_blob_bordered;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int h;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  int in_stack_00001c00;
  int in_stack_00001c08;
  int in_stack_00001c10;
  int in_stack_00001c18;
  int in_stack_00001c20;
  Mat *in_stack_00001c28;
  Option *in_stack_00001c30;
  int in_stack_00001e70;
  int in_stack_00001e78;
  int in_stack_00001e80;
  int in_stack_00001e88;
  int in_stack_00001e90;
  Mat *in_stack_00001e98;
  Option *in_stack_00001ea0;
  int in_stack_00002210;
  int in_stack_00002218;
  int in_stack_00002220;
  int in_stack_00002228;
  int in_stack_00002230;
  Mat *in_stack_00002238;
  Option *in_stack_00002240;
  int in_stack_fffffffffffff8f4;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  undefined8 in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  Mat *in_stack_fffffffffffff910;
  Mat *in_stack_fffffffffffff918;
  Mat *pMVar13;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  Deconvolution *in_stack_fffffffffffff928;
  float local_6c4;
  Allocator *in_stack_fffffffffffff970;
  bool local_5e5;
  int local_5bc;
  int local_59c;
  int local_584;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined4 local_568;
  long local_560;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined8 local_540;
  int local_534;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined4 local_518;
  long local_510;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined8 local_4f0;
  undefined8 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  int iVar14;
  undefined4 in_stack_fffffffffffffb28;
  int iVar15;
  undefined4 in_stack_fffffffffffffb2c;
  int iVar16;
  int in_stack_fffffffffffffb30;
  int iVar17;
  int in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  int iVar18;
  undefined4 in_stack_fffffffffffffb3c;
  int iVar19;
  Mat *in_stack_fffffffffffffb40;
  Mat *in_stack_fffffffffffffb48;
  Mat *in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  Mat *in_stack_fffffffffffffb80;
  Mat *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  int iVar20;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  Mat local_458;
  long local_410;
  int local_408;
  int local_404;
  int in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc44;
  Mat *bias_data;
  Mat *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  Mat *in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  Mat *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  Mat *in_stack_fffffffffffffd40;
  Mat *pMVar21;
  Mat *in_stack_fffffffffffffd88;
  Mat *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  Mat *in_stack_fffffffffffffda0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  long *local_1c8;
  undefined4 local_1c0;
  float local_1bc [3];
  long *local_1b0;
  undefined8 local_1a8;
  long *local_1a0;
  undefined8 local_198;
  long *local_190;
  undefined8 local_188;
  long *local_180;
  undefined8 local_178;
  long *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  long local_150;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined8 *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  long local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  Allocator *local_f8;
  int local_ec;
  size_t local_e8;
  void *local_e0;
  int local_d4;
  undefined1 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  Mat *in_stack_ffffffffffffff88;
  Option *in_stack_ffffffffffffff90;
  
  iVar16 = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  iVar20 = *(int *)((long)in_RSI + 0x2c);
  iVar19 = (int)in_RSI[6];
  pMVar13 = (Mat *)in_RSI[2];
  iVar18 = (int)in_RSI[3];
  iVar2 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  kernel_w = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1;
  iVar3 = (iVar20 + -1) * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) + iVar2 +
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc);
  local_404 = (iVar19 + -1) * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) + kernel_w
              + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100);
  local_408 = 1;
  if (((ulong)in_RCX->allocator & 0x100000000000000) != 0) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
      local_5bc = 8;
    }
    else {
      local_5bc = 1;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
        local_5bc = 4;
      }
    }
    local_408 = local_5bc;
  }
  local_410 = ((ulong)pMVar13 / (ulong)(long)iVar18) * (long)local_408;
  bias_data = &local_458;
  local_458.data = (void *)0x0;
  local_458.refcount = (int *)0x0;
  local_458.elemsize = 0;
  local_458.elempack = 0;
  local_458.allocator = (Allocator *)0x0;
  local_458.dims = 0;
  local_458.w = 0;
  local_458.h = 0;
  local_458.d = 0;
  local_458.c = 0;
  local_458.cstep = 0;
  iVar4 = (int)((ulong)in_stack_fffffffffffff908 >> 0x20);
  if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) < 1) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) < 1)) &&
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) < 1)) &&
     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) < 1 &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) < 1 ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) < 1)))))) {
    if (&local_458 != in_RDX) {
      if (in_RDX->refcount != (int *)0x0) {
        LOCK();
        *in_RDX->refcount = *in_RDX->refcount + 1;
        UNLOCK();
      }
      local_458.data = in_RDX->data;
      local_458.refcount = in_RDX->refcount;
      local_458.elemsize = in_RDX->elemsize;
      local_458.elempack = in_RDX->elempack;
      local_458.allocator = in_RDX->allocator;
      local_458.dims = in_RDX->dims;
      local_458.w = in_RDX->w;
      local_458.h = in_RDX->h;
      local_458.d = in_RDX->d;
      local_458.c = in_RDX->c;
      local_458.cstep = in_RDX->cstep;
    }
    Mat::create(in_stack_fffffffffffff910,iVar4,(int)in_stack_fffffffffffff908,iVar16,
                CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                in_stack_fffffffffffff8f4,in_stack_fffffffffffff970);
  }
  else {
    Mat::create(in_stack_fffffffffffff910,iVar4,(int)in_stack_fffffffffffff908,iVar16,
                CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                in_stack_fffffffffffff8f4,in_stack_fffffffffffff970);
  }
  pMVar21 = &local_458;
  local_5e5 = local_458.data == (void *)0x0 || local_458.cstep * (long)local_458.c == 0;
  if (local_5e5) {
    iVar20 = -100;
  }
  else {
    iVar4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    iVar16 = (int)in_RDI;
    if ((iVar18 == 8) && (local_408 == 8)) {
      lVar7 = *(long *)(*in_RDI + -0x18);
      deconvolution_pack8_avx
                (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                 in_stack_000000a4,in_stack_000000a0,*(int *)((long)in_RDI + lVar7 + 0xe0),
                 *(int *)((long)in_RDI + lVar7 + 0xe4),*(int *)((long)in_RDI + lVar7 + 0xe8),
                 *(int *)((long)in_RDI + lVar7 + 0x114),iVar16 + 0x118 + (int)lVar7,in_RCX,
                 (Option *)in_stack_fffffffffffff910);
    }
    if ((iVar18 == 4) && (local_408 == 8)) {
      lVar7 = *(long *)(*in_RDI + -0x18);
      deconvolution_pack4to8_avx
                (in_stack_fffffffffffffd40,
                 (Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30,
                 (Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 in_stack_fffffffffffffd24,in_stack_fffffffffffffd20,
                 *(int *)((long)in_RDI + lVar7 + 0xe0),*(int *)((long)in_RDI + lVar7 + 0xe4),
                 *(int *)((long)in_RDI + lVar7 + 0xe8),*(int *)((long)in_RDI + lVar7 + 0x114),
                 iVar16 + 0x118 + (int)lVar7,in_RCX,(Option *)in_stack_fffffffffffff910);
    }
    if ((iVar18 == 8) && (local_408 == 4)) {
      deconvolution_pack8to4_avx
                (in_stack_fffffffffffffda0,
                 (Mat *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(int)((ulong)pMVar21 >> 0x20),
                 (int)pMVar21,in_stack_00002210,in_stack_00002218,in_stack_00002220,
                 in_stack_00002228,in_stack_00002230,in_stack_00002238,in_stack_00002240);
    }
    if ((iVar18 == 1) && (local_408 == 8)) {
      lVar7 = *(long *)(*in_RDI + -0x18);
      deconvolution_pack1to8_avx
                (in_stack_fffffffffffffc60,
                 (Mat *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 in_stack_fffffffffffffc50,bias_data,in_stack_fffffffffffffc44,
                 in_stack_fffffffffffffc40,*(int *)((long)in_RDI + lVar7 + 0xe0),
                 *(int *)((long)in_RDI + lVar7 + 0xe4),*(int *)((long)in_RDI + lVar7 + 0xe8),
                 *(int *)((long)in_RDI + lVar7 + 0x114),iVar16 + 0x118 + (int)lVar7,in_RCX,
                 (Option *)in_stack_fffffffffffff910);
    }
    if ((iVar18 == 8) && (local_408 == 1)) {
      lVar7 = *(long *)(*in_RDI + -0x18);
      deconvolution_pack8to1_avx
                ((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (Mat *)CONCAT44(iVar4,in_stack_fffffffffffffb90),in_stack_fffffffffffffb88,
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78,
                 *(int *)((long)in_RDI + lVar7 + 0xe0),*(int *)((long)in_RDI + lVar7 + 0xe4),
                 *(int *)((long)in_RDI + lVar7 + 0xe8),*(int *)((long)in_RDI + lVar7 + 0x114),
                 iVar16 + 0x118 + (int)lVar7,in_RCX,(Option *)in_stack_fffffffffffff910);
    }
    if ((iVar18 == 4) && (local_408 == 4)) {
      deconvolution_pack4_sse
                (in_RCX,(Mat *)CONCAT44(iVar20,iVar19),pMVar13,(Mat *)CONCAT44(4,iVar2),kernel_w,
                 iVar3,in_stack_00001e70,in_stack_00001e78,in_stack_00001e80,in_stack_00001e88,
                 in_stack_00001e90,in_stack_00001e98,in_stack_00001ea0);
    }
    if ((iVar18 == 1) && (local_408 == 4)) {
      deconvolution_pack1to4_sse
                (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                 (Mat *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb34,in_stack_fffffffffffffb30,in_stack_00001c00,
                 in_stack_00001c08,in_stack_00001c10,in_stack_00001c18,in_stack_00001c20,
                 in_stack_00001c28,in_stack_00001c30);
    }
    if ((iVar18 == 4) && (local_408 == 1)) {
      deconvolution_pack4to1_sse
                ((Mat *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18,
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff90);
    }
    if ((iVar18 == 1) && (local_408 == 1)) {
      for (iVar20 = 0; iVar20 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          iVar20 = iVar20 + 1) {
        pvVar9 = (void *)((long)local_458.data + local_458.cstep * (long)iVar20 * local_458.elemsize
                         );
        local_c8 = &stack0xfffffffffffffb40;
        local_b8 = (long)local_458.w * (long)local_458.h * local_458.elemsize;
        local_bc = 0x10;
        local_d4 = local_458.d;
        local_e8 = local_458.elemsize;
        local_ec = local_458.elempack;
        local_f8 = local_458.allocator;
        iVar19 = *(int *)((long)in_RSI + 0x2c);
        iVar18 = (int)in_RSI[6];
        iVar3 = (int)in_RSI[7];
        iVar16 = local_458.h;
        iVar17 = local_458.w;
        local_e0 = pvVar9;
        for (iVar15 = 0; iVar15 < iVar16; iVar15 = iVar15 + 1) {
          for (iVar14 = 0; iVar14 < iVar17; iVar14 = iVar14 + 1) {
            local_6c4 = 0.0;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0) {
              local_6c4 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a8) +
                                    (long)iVar20 * 4);
            }
            local_13c = *(undefined4 *)((long)in_RDI + 0x34);
            local_140 = (undefined4)in_RDI[7];
            local_144 = *(undefined4 *)((long)in_RDI + 0x3c);
            local_150 = in_RDI[1] + in_RDI[9] * (long)iVar20 * in_RDI[3];
            local_158 = in_RDI[3];
            local_15c = (undefined4)in_RDI[4];
            local_168 = in_RDI[5];
            local_138 = &local_530;
            local_530 = 0;
            local_520 = 0;
            local_518 = 0;
            local_508 = 0;
            local_504 = 0;
            local_500 = 0;
            local_4fc = 0;
            local_4f8 = 0;
            local_4f0 = 0;
            local_528 = 0;
            lVar7 = local_150;
            for (local_534 = 0; local_534 < iVar3; local_534 = local_534 + 1) {
              local_104 = *(int *)((long)in_RSI + 0x2c);
              local_108 = (int)in_RSI[6];
              local_10c = *(undefined4 *)((long)in_RSI + 0x34);
              local_118 = *in_RSI + in_RSI[8] * (long)local_534 * in_RSI[2];
              local_120 = in_RSI[2];
              local_124 = (undefined4)in_RSI[3];
              local_130 = in_RSI[4];
              local_100 = &local_580;
              local_a8 = (long)local_104 * (long)local_108 * local_120;
              local_ac = 0x10;
              for (local_584 = 0;
                  local_584 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                  local_584 = local_584 + 1) {
                iVar5 = (iVar15 + local_584 *
                                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0)) -
                        (kernel_w + -1);
                if (((-1 < iVar5) &&
                    (iVar5 % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0)) &&
                   (iVar5 = iVar5 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8),
                   iVar5 < iVar18)) {
                  for (local_59c = 0;
                      local_59c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                      local_59c = local_59c + 1) {
                    iVar6 = (iVar14 + local_59c *
                                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) -
                            (iVar2 + -1);
                    if (((-1 < iVar6) &&
                        (iVar6 % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0))
                       && (iVar6 = iVar6 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4
                                                   ), iVar6 < iVar19)) {
                      local_6c4 = *(float *)(local_118 + (long)local_104 * (long)iVar5 * local_120 +
                                            (long)iVar6 * 4) *
                                  *(float *)(lVar7 + (long)(local_584 *
                                                            *(int *)((long)in_RDI +
                                                                    *(long *)(*in_RDI + -0x18) +
                                                                    0xd4) + local_59c) * 4) +
                                  local_6c4;
                    }
                  }
                }
              }
              lVar7 = lVar7 + (long)iVar4 * 4;
              local_580 = 0;
              local_570 = 0;
              local_568 = 0;
              local_558 = 0;
              local_554 = 0;
              local_550 = 0;
              local_54c = 0;
              local_548 = 0;
              local_540 = 0;
              local_578 = 0;
              local_560 = local_130;
            }
            local_1c0 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
            local_1c8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
            local_1bc[0] = local_6c4;
            local_510 = local_168;
            switch(local_1c0) {
            case 1:
              dVar12 = std::fmax((double)(ulong)(uint)local_6c4,0.0);
              local_1bc[0] = SUB84(dVar12,0);
              break;
            case 2:
              local_178 = 0;
              local_1cc = *(float *)*local_1c8;
              if (local_6c4 <= 0.0) {
                local_6c4 = local_6c4 * local_1cc;
              }
              local_1bc[0] = local_6c4;
              local_170 = local_1c8;
              break;
            case 3:
              local_188 = 0;
              local_1d0 = *(float *)*local_1c8;
              local_198 = 1;
              local_1d4 = *(float *)(*local_1c8 + 4);
              if (local_6c4 < local_1d0) {
                local_1bc[0] = local_1d0;
              }
              local_190 = local_1c8;
              local_180 = local_1c8;
              if (local_1d4 < local_1bc[0]) {
                local_1bc[0] = local_1d4;
              }
              break;
            case 4:
              local_1d8 = 88.37626;
              pfVar8 = std::min<float>(local_1bc,&local_1d8);
              local_1bc[0] = *pfVar8;
              local_1dc = -88.37626;
              pfVar8 = std::max<float>(local_1bc,&local_1dc);
              local_1bc[0] = *pfVar8;
              dVar12 = std::exp((double)(ulong)(uint)-local_1bc[0]);
              local_1bc[0] = 1.0 / (SUB84(dVar12,0) + 1.0);
              break;
            case 5:
              dVar12 = std::exp((double)(ulong)(uint)local_6c4);
              dVar12 = std::log((double)(ulong)(uint)(SUB84(dVar12,0) + 1.0));
              dVar12 = std::tanh(dVar12);
              local_1bc[0] = local_6c4 * SUB84(dVar12,0);
              break;
            case 6:
              local_1a8 = 0;
              fVar1 = *(float *)*local_1c8;
              local_1bc[1] = 1.4013e-45;
              local_1bc[2] = 0.0;
              fVar11 = -*(float *)(*local_1c8 + 4) / fVar1;
              local_1b0 = local_1c8;
              local_1a0 = local_1c8;
              if (fVar11 <= local_6c4) {
                if (local_6c4 <= 1.0 / fVar1 + fVar11) {
                  local_1bc[0] = local_6c4 * (local_6c4 * fVar1 + *(float *)(*local_1c8 + 4));
                }
              }
              else {
                local_1bc[0] = 0.0;
              }
            }
            *(float *)((long)pvVar9 + (long)iVar14 * 4) = local_1bc[0];
          }
          pvVar9 = (void *)((long)pvVar9 + (long)iVar17 * 4);
        }
      }
    }
    Deconvolution::cut_padding
              (in_stack_fffffffffffff928,
               (Mat *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918,(Option *)in_stack_fffffffffffff910);
    bVar10 = true;
    if (in_RDX->data != (void *)0x0) {
      bVar10 = in_RDX->cstep * (long)in_RDX->c == 0;
    }
    if (bVar10) {
      iVar20 = -100;
    }
    else {
      iVar20 = 0;
    }
  }
  pMVar13 = &local_458;
  if (local_458.refcount != (int *)0x0) {
    LOCK();
    iVar19 = *local_458.refcount;
    *local_458.refcount = *local_458.refcount + -1;
    UNLOCK();
    if (iVar19 == 1) {
      if (local_458.allocator == (Allocator *)0x0) {
        if (local_458.data != (void *)0x0) {
          free(local_458.data);
        }
      }
      else {
        (*(local_458.allocator)->_vptr_Allocator[3])(local_458.allocator,local_458.data);
      }
    }
  }
  pMVar13->data = (void *)0x0;
  pMVar13->elemsize = 0;
  pMVar13->elempack = 0;
  pMVar13->dims = 0;
  pMVar13->w = 0;
  pMVar13->h = 0;
  pMVar13->d = 0;
  pMVar13->c = 0;
  pMVar13->cstep = 0;
  pMVar13->refcount = (int *)0x0;
  return iVar20;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}